

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::DescriptorProto> *t;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *t_00;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *t_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *t_02;
  FileDescriptorProto *this_local;
  
  t = message_type(this);
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>>
                    (t);
  if (bVar1) {
    t_00 = enum_type(this);
    bVar1 = internal::
            AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>>
                      (t_00);
    if (bVar1) {
      t_01 = service(this);
      bVar1 = internal::
              AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>>
                        (t_01);
      if (bVar1) {
        t_02 = extension(this);
        bVar1 = internal::
                AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                          (t_02);
        if (bVar1) {
          bVar1 = has_options(this);
          if ((!bVar1) || (bVar1 = FileOptions::IsInitialized(this->options_), bVar1)) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->message_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->enum_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->service())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->extension())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}